

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O3

void __thiscall absl::lts_20250127::log_internal::LogMessage::SendToLog(LogMessage *this)

{
  LogMessageData *this_00;
  ulong uVar1;
  bool bVar2;
  LogEntry *entry;
  undefined1 in_R8B;
  Span<absl::lts_20250127::LogSink_*> extra_sinks;
  
  if ((((this->data_)._M_t.
        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        ._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
       ._M_head_impl)->entry).severity_ == kFatal) {
    bVar2 = ExitOnDFatal();
    if (bVar2) {
      PrepareToDie(this);
    }
  }
  this_00 = (this->data_)._M_t.
            super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            ._M_t.
            super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
            .
            super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
            ._M_head_impl;
  uVar1 = *(ulong *)&(this_00->extra_sinks).storage_;
  if ((uVar1 & 1) == 0) {
    entry = (LogEntry *)((long)&(this_00->extra_sinks).storage_ + 8);
  }
  else {
    entry = (LogEntry *)
            (((Data *)((long)&(this_00->extra_sinks).storage_ + 8))->allocated).allocated_data;
  }
  extra_sinks.ptr_ = uVar1 >> 1;
  extra_sinks.len_._0_1_ = this_00->extra_sinks_only;
  extra_sinks.len_._1_7_ = 0;
  LogToSinks((log_internal *)this_00,entry,extra_sinks,(bool)in_R8B);
  if ((((this->data_)._M_t.
        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        ._M_t.
        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
        .
        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
       ._M_head_impl)->entry).severity_ == kFatal) {
    bVar2 = ExitOnDFatal();
    if (bVar2) {
      Die(this);
    }
  }
  return;
}

Assistant:

void LogMessage::SendToLog() {
  if (IsFatal()) PrepareToDie();
  // Also log to all registered sinks, even if OnlyLogToStderr() is set.
  log_internal::LogToSinks(data_->entry, absl::MakeSpan(data_->extra_sinks),
                           data_->extra_sinks_only);
  if (IsFatal()) Die();
}